

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CoverageOptionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CoverageOptionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          ExpressionSyntax *args_1,Token *args_2)

{
  Token semi;
  CoverageOptionSyntax *pCVar1;
  CoverageOptionSyntax *in_RCX;
  BumpAllocator *in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  
  pCVar1 = (CoverageOptionSyntax *)allocate(in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  semi.info = in_RSI;
  semi._0_8_ = in_RDX;
  slang::syntax::CoverageOptionSyntax::CoverageOptionSyntax
            (in_RCX,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                    (in_RCX->super_MemberSyntax).super_SyntaxNode.parent,
             *(ExpressionSyntax **)&(in_RCX->super_MemberSyntax).super_SyntaxNode,semi);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }